

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O1

void secp256k1_testrand_flip(uchar *b,size_t len)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar2 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
          secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
  uVar4 = secp256k1_test_state[1] << 0x11;
  uVar5 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
  uVar3 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
  secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar5;
  secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar3;
  secp256k1_test_state[2] = uVar5 ^ uVar4;
  secp256k1_test_state[3] = uVar3 << 0x2d | uVar3 >> 0x13;
  uVar1 = secp256k1_testrand_int((uint32_t)len);
  b[uVar1] = b[uVar1] ^ '\x01' << (byte)((ulong)lVar2 >> 0x3d);
  return;
}

Assistant:

static void secp256k1_testrand_flip(unsigned char *b, size_t len) {
    b[secp256k1_testrand_int(len)] ^= (1 << secp256k1_testrand_bits(3));
}